

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_joinref.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::BindColumn(duckdb *this,Binder *binder,ClientContext *context,BindingAlias *alias,
                  string *column_name)

{
  BoundExpression *this_00;
  pointer *__ptr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> result;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> expr;
  ExpressionBinder expr_binder;
  undefined1 local_98 [16];
  _Head_base<0UL,_duckdb::Expression_*,_false> local_88;
  ExpressionBinder local_80;
  
  make_uniq_base<duckdb::ParsedExpression,duckdb::ColumnRefExpression,std::__cxx11::string_const&,duckdb::BindingAlias_const&>
            ((duckdb *)(local_98 + 8),column_name,alias);
  ExpressionBinder::ExpressionBinder(&local_80,binder,context,false);
  ExpressionBinder::Bind
            ((ExpressionBinder *)local_98,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_80,(LogicalType *)(local_98 + 8),false);
  this_00 = (BoundExpression *)operator_new(0x40);
  local_88._M_head_impl = (Expression *)local_98._0_8_;
  local_98._0_8_ = (_func_int **)0x0;
  BoundExpression::BoundExpression
            (this_00,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_88);
  if (local_88._M_head_impl != (Expression *)0x0) {
    (*((local_88._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  *(BoundExpression **)this = this_00;
  if ((_func_int **)local_98._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_98._0_8_ + 8))();
  }
  ExpressionBinder::~ExpressionBinder(&local_80);
  if ((long *)local_98._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_98._8_8_ + 8))();
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

static unique_ptr<ParsedExpression> BindColumn(Binder &binder, ClientContext &context, const BindingAlias &alias,
                                               const string &column_name) {
	auto expr = make_uniq_base<ParsedExpression, ColumnRefExpression>(column_name, alias);
	ExpressionBinder expr_binder(binder, context);
	auto result = expr_binder.Bind(expr);
	return make_uniq<BoundExpression>(std::move(result));
}